

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash.cpp
# Opt level: O2

OptError * multihash::decode(OptError *__return_storage_ptr__,string *str,Multihash *m)

{
  Multihash *in_RCX;
  Bytes buf;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  binary::decodeHex((Bytes *)&local_30,str);
  decode_abi_cxx11_(__return_storage_ptr__,(multihash *)&local_30,(Bytes *)m,in_RCX);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

OptError decode(std::string str, Multihash &m) {
	Bytes buf = binary::decodeHex(str);
	return decode(buf, m);
}